

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void kj::UnixEventPort::ignoreSigpipe(void)

{
  int iVar1;
  anon_class_1_0_00000001 *this;
  
  if (ignoreSigpipe()::once == '\0') {
    this = (anon_class_1_0_00000001 *)&ignoreSigpipe()::once;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      ignoreSigpipe::anon_class_1_0_00000001::operator()(this);
      __cxa_guard_release(&ignoreSigpipe()::once);
      return;
    }
  }
  return;
}

Assistant:

void UnixEventPort::ignoreSigpipe() {
  // We disable SIGPIPE because users of UnixEventPort almost certainly don't want it.
  //
  // We've observed that when starting many threads at the same time, this can cause some
  // contention on the kernel's signal handler table lock, so we try to run it only once.
  static bool once KJ_UNUSED = []() {
    while (signal(SIGPIPE, SIG_IGN) == SIG_ERR) {
      int error = errno;
      if (error != EINTR) {
        KJ_FAIL_SYSCALL("signal(SIGPIPE, SIG_IGN)", error);
      }
    }
    return true;
  }();
}